

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_> segments;
  shared_ptr<ls::LSDDetection> lsd;
  Mat result;
  Mat img;
  long *local_168;
  undefined8 uStack_160;
  long local_158 [3];
  vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_> local_140;
  _InputArray local_128;
  LSDDetection *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  long *local_f0 [2];
  long local_e0 [10];
  string local_90 [64];
  int *local_50;
  
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"/home/soumyadeep/test.jpg","")
  ;
  cv::imread(local_90,(int)local_f0);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  cv::Mat::clone();
  iVar1 = *local_50;
  iVar2 = local_50[1];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," x ",3);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  ls::createLSDDetector((ls *)&local_110,(Mat *)local_90);
  ls::LSDDetection::detectLines(&local_140,local_110);
  if (local_140.super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_140.super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar6 = 0xc;
    uVar5 = 0;
    do {
      local_f8 = *(undefined8 *)
                  ((long)local_140.
                         super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar6 + -0xc);
      local_100 = *(undefined8 *)
                   ((long)local_140.
                          super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar6 + -4);
      local_128.sz.width = 0;
      local_128.sz.height = 0;
      local_128.flags = 0x3010000;
      local_128.obj = local_f0;
      local_168 = (long *)0x0;
      uStack_160 = 0;
      local_158[0] = 0x406fe00000000000;
      local_158[1] = 0;
      cv::line(&local_128,&local_f8,&local_100,&local_168,2,0x10,0);
      uVar5 = uVar5 + 1;
      uVar4 = ((long)local_140.super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_140.super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
      lVar6 = lVar6 + 0x14;
    } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
  }
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"image","");
  local_128.sz.width = 0;
  local_128.sz.height = 0;
  local_128.flags = 0x1010000;
  local_128.obj = local_90;
  cv::imshow((string *)&local_168,&local_128);
  if (local_168 != local_158) {
    operator_delete(local_168,local_158[0] + 1);
  }
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"result_img","");
  local_128.sz.width = 0;
  local_128.sz.height = 0;
  local_128.flags = 0x1010000;
  local_128.obj = local_f0;
  cv::imshow((string *)&local_168,&local_128);
  if (local_168 != local_158) {
    operator_delete(local_168,local_158[0] + 1);
  }
  cv::waitKey(0);
  if (local_140.super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  cv::Mat::~Mat((Mat *)local_f0);
  cv::Mat::~Mat((Mat *)local_90);
  return 0;
}

Assistant:

int main()
{
    const cv::Mat img = cv::imread("/home/soumyadeep/test.jpg");
    cv::Mat result = img.clone();
    std::cout<<img.size()<<std::endl;
    auto lsd = createLSDDetector(img);
    auto segments = lsd->detectLines();

    
    cv::Point pt1, pt2;
    for (int j = 0; j < segments.size(); ++j) {
    	pt1 = segments[j].p1;
    	pt2 = segments[j].p2;

    	cv::line(result, pt1, pt2, cv::Scalar(0, 0, 255), 2, cv::LINE_AA);
    }

    cv::imshow("image", img);
    cv::imshow("result_img", result);
    cv::waitKey();
    return 0;
}